

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error asmjit::v1_14::x86::X86Internal_setupSaveRestoreInfo
                (RegGroup group,FuncFrame *frame,Reg *xReg,uint32_t *xInst,uint32_t *xSize)

{
  uint32_t uVar1;
  uint32_t *in_RCX;
  uint *in_RDX;
  char in_DIL;
  uint *in_R8;
  undefined4 uVar2;
  FuncFrame *in_stack_fffffffffffffe10;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  uint *local_1c0;
  uint32_t *local_1b8;
  uint *local_1b0;
  Error local_198;
  undefined4 local_194;
  undefined8 *local_190;
  undefined4 local_138;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  undefined4 *local_120;
  undefined8 *local_118;
  undefined4 local_10c;
  undefined4 *local_108;
  undefined8 *local_100;
  undefined4 local_f4;
  undefined4 *local_f0;
  undefined8 *local_e8;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 *local_d0;
  undefined8 *local_c8;
  
  if (in_DIL == '\x01') {
    local_190 = &local_1d0;
    local_194 = 0;
    local_134 = 0;
    local_138 = 0x10000161;
    local_120 = &local_138;
    local_124 = 0;
    local_10c = 0;
    local_f4 = 0;
    local_d4 = 0;
    local_d8 = 0;
    local_dc = 0;
    local_1d0._0_4_ = 0x10000161;
    local_1d0._4_4_ = 0;
    uStack_1c8._0_4_ = 0;
    uStack_1c8._4_4_ = 0;
    *(undefined8 *)in_RDX = local_1d0;
    *(undefined8 *)(in_RDX + 2) = uStack_1c8;
    local_1c0 = in_R8;
    local_1b8 = in_RCX;
    local_1b0 = in_RDX;
    local_130 = local_190;
    local_118 = local_190;
    local_108 = local_120;
    local_100 = local_190;
    local_f0 = local_120;
    local_e8 = local_190;
    local_d0 = local_120;
    local_c8 = local_190;
    uVar1 = getXmmMovInst(in_stack_fffffffffffffe10);
    *local_1b8 = uVar1;
    *local_1c0 = *local_1b0 >> 0x18;
    local_198 = 0;
  }
  else if (in_DIL == '\x02') {
    local_1e0._0_4_ = 0x289;
    local_1e0._4_4_ = 0;
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    *(undefined8 *)in_RDX = local_1e0;
    *(undefined8 *)(in_RDX + 2) = local_1d8;
    *in_RCX = 0x167;
    *in_R8 = *in_RDX >> 0x18;
    local_198 = 0;
  }
  else if (in_DIL == '\x03') {
    uVar2 = 0x8000391;
    uVar2 = 0;
    local_1e8._0_4_ = 0;
    local_1e8._4_4_ = 0;
    *(FuncFrame **)in_RDX = in_stack_fffffffffffffe10;
    *(undefined8 *)(in_RDX + 2) = local_1e8;
    *in_RCX = 0x1d3;
    *in_R8 = *in_RDX >> 0x18;
    local_198 = 0;
  }
  else {
    local_198 = DebugUtils::errored(3);
  }
  return local_198;
}

Assistant:

static inline Error X86Internal_setupSaveRestoreInfo(RegGroup group, const FuncFrame& frame, Reg& xReg, uint32_t& xInst, uint32_t& xSize) noexcept {
  switch (group) {
    case RegGroup::kVec:
      xReg = xmm(0);
      xInst = getXmmMovInst(frame);
      xSize = xReg.size();
      return kErrorOk;

    case RegGroup::kX86_K:
      xReg = k(0);
      xInst = Inst::kIdKmovq;
      xSize = xReg.size();
      return kErrorOk;

    case RegGroup::kX86_MM:
      xReg = mm(0);
      xInst = Inst::kIdMovq;
      xSize = xReg.size();
      return kErrorOk;

    default:
      // This would be a bug in AsmJit if hit.
      return DebugUtils::errored(kErrorInvalidState);
  }
}